

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_stepping.cpp
# Opt level: O0

void test_2d_static<2ul,1ul,30ul,1ul>(void)

{
  ulong uVar1;
  value_type vVar2;
  long lVar3;
  size_type sVar4;
  value_type vVar5;
  value_type vVar6;
  value_type vVar7;
  value_type vVar8;
  size_type sVar9;
  bool bVar10;
  int local_19c [2];
  dimensions<2UL,_1UL> local_193 [2];
  dimensions<2UL,_1UL> local_191;
  size_type local_190;
  unsigned_long local_188;
  value_type true_idx_2;
  int local_178;
  int i_2;
  int j_2;
  int *local_168;
  size_type local_160;
  unsigned_long local_158;
  size_t true_idx_1;
  int iStack_148;
  dimensions<2UL,_1UL> s;
  int i_1;
  int j_1;
  int *local_138;
  size_type local_130;
  unsigned_long local_128;
  value_type true_idx;
  int i;
  int j;
  int dptr [30];
  unsigned_long local_98;
  size_type local_90;
  unsigned_long local_88;
  size_type local_80;
  unsigned_long local_78;
  size_type local_70;
  unsigned_long local_68;
  size_type local_60;
  bool local_56;
  bool local_55;
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15UL,_1UL>,_std::experimental::dimensions<2UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
  local_54;
  unsigned_long uStack_50;
  layout_mapping_left<dimensions<30UL___2UL,_1UL___1UL>,_dimensions<2UL,_1UL>,_dimensions<0,_0>_>
  sub_l;
  size_type local_48;
  unsigned_long local_40;
  size_type local_38;
  int local_2c;
  size_type local_28;
  int local_1c;
  size_type local_18;
  bool local_e;
  bool local_d;
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
  local_c [2];
  layout_mapping_left<dimensions<30UL,_1UL>,_dimensions<1,_1>,_dimensions<0,_0>_> l;
  
  std::experimental::
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
  ::layout_mapping_regular_precomputed_strides(local_c);
  local_d = std::experimental::detail::
            layout_mapping_regular_base<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
            ::is_regular();
  local_e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0xb9,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&local_d,&local_e);
  local_18 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::stride(local_c,0);
  local_1c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0xbb,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&local_18,&local_1c
            );
  local_28 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::stride(local_c,1);
  local_2c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0xbc,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&local_28,&local_2c
            );
  local_38 = std::experimental::dimensions<30UL,_1UL>::size((dimensions<30UL,_1UL> *)local_c);
  local_40 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0xbe,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&local_38,&local_40
            );
  local_48 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::span(&local_c[0].
                     super_layout_mapping_regular_base<std::experimental::dimensions<30UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                   );
  uStack_50 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0xbf,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&local_48,
             &stack0xffffffffffffffb0);
  std::experimental::
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15UL,_1UL>,_std::experimental::dimensions<2UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
  ::layout_mapping_regular_precomputed_strides(&local_54);
  local_55 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<15UL,_1UL>,_std::experimental::dimensions<2UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::is_regular();
  local_56 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0xc5,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&local_55,&local_56
            );
  local_60 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15UL,_1UL>,_std::experimental::dimensions<2UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::stride(&local_54,0);
  local_68 = 2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,199,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&local_60,&local_68)
  ;
  local_70 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15UL,_1UL>,_std::experimental::dimensions<2UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::stride(&local_54,1);
  local_78 = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","M",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,200,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&local_70,&local_78)
  ;
  local_80 = std::experimental::dimensions<15UL,_1UL>::size((dimensions<15UL,_1UL> *)&local_54);
  local_88 = 0xf;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / N) * (Y / M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0xca,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&local_80,&local_88
            );
  local_90 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<15UL,_1UL>,_std::experimental::dimensions<2UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::span(&local_54.
                     super_layout_mapping_regular_base<std::experimental::dimensions<15UL,_1UL>,_std::experimental::dimensions<2UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                   );
  local_98 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0xcb,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&local_90,&local_98
            );
  true_idx._4_4_ = 0;
  while( true ) {
    uVar1 = (ulong)true_idx._4_4_;
    vVar2 = std::experimental::dimensions<30UL,_1UL>::operator[]<int>
                      ((dimensions<30UL,_1UL> *)local_c,1);
    if (vVar2 <= uVar1) break;
    true_idx._0_4_ = 0;
    while( true ) {
      uVar1 = (ulong)(int)true_idx;
      vVar2 = std::experimental::dimensions<30UL,_1UL>::operator[]<int>
                        ((dimensions<30UL,_1UL> *)local_c,0);
      if (vVar2 <= uVar1) break;
      lVar3 = (long)(int)true_idx;
      vVar2 = std::experimental::dimensions<30UL,_1UL>::operator[]<int>
                        ((dimensions<30UL,_1UL> *)local_c,0);
      local_128 = lVar3 + vVar2 * (long)true_idx._4_4_;
      local_130 = std::experimental::
                  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                  ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                    *)local_c,(int)true_idx,true_idx._4_4_);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0xd5,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&local_130,
                 &local_128);
      sVar4 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                *)local_c,(int)true_idx,true_idx._4_4_);
      local_138 = &i + sVar4;
      _j_1 = &i + local_128;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0xd7,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&local_138,
                 (int **)&j_1);
      sVar4 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                *)local_c,(int)true_idx,true_idx._4_4_);
      (&i)[sVar4] = 0x2a;
      sVar4 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                *)local_c,(int)true_idx,true_idx._4_4_);
      i_1 = 0x2a;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0xdb,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&i + sVar4,&i_1
                );
      true_idx._0_4_ = (int)true_idx + 1;
    }
    true_idx._4_4_ = true_idx._4_4_ + 1;
  }
  iStack_148 = 0;
  while( true ) {
    uVar1 = (ulong)iStack_148;
    vVar5 = std::experimental::dimensions<15UL,_1UL>::operator[]<int>
                      ((dimensions<15UL,_1UL> *)&local_54,1);
    if (vVar5 <= uVar1) break;
    true_idx_1._4_4_ = 0;
    while( true ) {
      uVar1 = (ulong)true_idx_1._4_4_;
      vVar5 = std::experimental::dimensions<15UL,_1UL>::operator[]<int>
                        ((dimensions<15UL,_1UL> *)&local_54,0);
      if (vVar5 <= uVar1) break;
      std::experimental::detail::
      layout_mapping_regular_base<std::experimental::dimensions<15UL,_1UL>,_std::experimental::dimensions<2UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
      ::steps(&local_54.
               super_layout_mapping_regular_base<std::experimental::dimensions<15UL,_1UL>,_std::experimental::dimensions<2UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             );
      vVar6 = std::experimental::dimensions<2UL,_1UL>::operator[]<int>
                        ((dimensions<2UL,_1UL> *)((long)&true_idx_1 + 3),0);
      lVar3 = (long)true_idx_1._4_4_;
      vVar5 = std::experimental::dimensions<15UL,_1UL>::operator[]<int>
                        ((dimensions<15UL,_1UL> *)&local_54,0);
      vVar7 = std::experimental::dimensions<2UL,_1UL>::operator[]<int>
                        ((dimensions<2UL,_1UL> *)((long)&true_idx_1 + 3),0);
      vVar8 = std::experimental::dimensions<2UL,_1UL>::operator[]<int>
                        ((dimensions<2UL,_1UL> *)((long)&true_idx_1 + 3),1);
      local_158 = vVar6 * lVar3 + vVar5 * vVar7 * vVar8 * (long)iStack_148;
      local_160 = std::experimental::
                  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,1ul>,std::experimental::dimensions<2ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                  ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,1ul>,std::experimental::dimensions<2ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                    *)&local_54,true_idx_1._4_4_,iStack_148);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0xe5,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&local_160,
                 &local_158);
      sVar9 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,1ul>,std::experimental::dimensions<2ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,1ul>,std::experimental::dimensions<2ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                *)&local_54,true_idx_1._4_4_,iStack_148);
      local_168 = &i + sVar9;
      _j_2 = &i + local_158;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0xe7,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&local_168,
                 (int **)&j_2);
      sVar9 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,1ul>,std::experimental::dimensions<2ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,1ul>,std::experimental::dimensions<2ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                *)&local_54,true_idx_1._4_4_,iStack_148);
      (&i)[sVar9] = 0x11;
      sVar9 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,1ul>,std::experimental::dimensions<2ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<15ul,1ul>,std::experimental::dimensions<2ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                *)&local_54,true_idx_1._4_4_,iStack_148);
      i_2 = 0x11;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0xeb,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&i + sVar9,&i_2
                );
      true_idx_1._4_4_ = true_idx_1._4_4_ + 1;
    }
    iStack_148 = iStack_148 + 1;
  }
  local_178 = 0;
  while( true ) {
    uVar1 = (ulong)local_178;
    vVar2 = std::experimental::dimensions<30UL,_1UL>::operator[]<int>
                      ((dimensions<30UL,_1UL> *)local_c,1);
    if (vVar2 <= uVar1) break;
    true_idx_2._4_4_ = 0;
    while( true ) {
      uVar1 = (ulong)true_idx_2._4_4_;
      vVar2 = std::experimental::dimensions<30UL,_1UL>::operator[]<int>
                        ((dimensions<30UL,_1UL> *)local_c,0);
      if (vVar2 <= uVar1) break;
      lVar3 = (long)true_idx_2._4_4_;
      vVar2 = std::experimental::dimensions<30UL,_1UL>::operator[]<int>
                        ((dimensions<30UL,_1UL> *)local_c,0);
      local_188 = lVar3 + vVar2 * (long)local_178;
      local_190 = std::experimental::
                  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                  ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                    *)local_c,true_idx_2._4_4_,local_178);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0xf4,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&local_190,
                 &local_188);
      uVar1 = (ulong)true_idx_2._4_4_;
      std::experimental::detail::
      layout_mapping_regular_base<std::experimental::dimensions<15UL,_1UL>,_std::experimental::dimensions<2UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
      ::steps(&local_54.
               super_layout_mapping_regular_base<std::experimental::dimensions<15UL,_1UL>,_std::experimental::dimensions<2UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             );
      vVar6 = std::experimental::dimensions<2UL,_1UL>::operator[]<int>(&local_191,0);
      bVar10 = false;
      if (uVar1 % vVar6 == 0) {
        uVar1 = (ulong)local_178;
        std::experimental::detail::
        layout_mapping_regular_base<std::experimental::dimensions<15UL,_1UL>,_std::experimental::dimensions<2UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
        ::steps(&local_54.
                 super_layout_mapping_regular_base<std::experimental::dimensions<15UL,_1UL>,_std::experimental::dimensions<2UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
               );
        vVar6 = std::experimental::dimensions<2UL,_1UL>::operator[]<int>(local_193,1);
        bVar10 = uVar1 % vVar6 == 0;
      }
      if (bVar10) {
        sVar4 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)local_c,true_idx_2._4_4_,local_178);
        local_19c[1] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                   ,0xfb,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&i + sVar4,
                   local_19c + 1);
      }
      else {
        sVar4 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)local_c,true_idx_2._4_4_,local_178);
        local_19c[0] = 0x2a;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                   ,0x100,"void test_2d_static() [N = 2UL, M = 1UL, X = 30UL, Y = 1UL]",&i + sVar4,
                   local_19c);
      }
      true_idx_2._4_4_ = true_idx_2._4_4_ + 1;
    }
    local_178 = local_178 + 1;
  }
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");
    static_assert(0 == (Y % M), "Y must be divisable by M");

    layout_mapping_left<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<0, 0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    layout_mapping_left<
        dimensions<X / N, Y / M>, dimensions<N, M>, dimensions<0, 0> 
    > const sub_l{};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);
    BOOST_TEST_EQ((sub_l.stride(1)), M);

    BOOST_TEST_EQ((sub_l.size()), (X / N) * (Y / M));
    BOOST_TEST_EQ((sub_l.span()), X * Y);

    int dptr[X * Y];

    // Set all elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set every (Nth, Mth) element to 17.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.steps();
        auto const true_idx = (s[0] * i) + (sub_l[0] * s[0]) * (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 17);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // Element in the strided sub-box.
        if (  (0 == (i % sub_l.steps()[0]))
           && (0 == (j % sub_l.steps()[1]))
           )
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}